

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorChildUnitsNotFound_Test::~Units_scalingFactorChildUnitsNotFound_Test
          (Units_scalingFactorChildUnitsNotFound_Test *this)

{
  Units_scalingFactorChildUnitsNotFound_Test *this_local;
  
  ~Units_scalingFactorChildUnitsNotFound_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorChildUnitsNotFound)
{
    auto model = libcellml::Model::create("nurseryrhymes");
    auto u1 = libcellml::Units::create("bo_peep");
    u1->addUnit("sheep");

    auto u2 = libcellml::Units::create("flock");

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}